

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

visit_behavior __thiscall
dtc::fdt::node::visit
          (node *this,
          function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)> *fn,
          node *parent)

{
  bool bVar1;
  visit_behavior vVar2;
  element_type *this_00;
  function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)> local_70;
  __shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_50;
  shared_ptr<dtc::fdt::node> *c;
  iterator __end4;
  iterator __begin4;
  vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
  *__range4;
  visit_behavior behavior;
  node *parent_local;
  function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)> *fn_local;
  node *this_local;
  
  vVar2 = std::function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)>::
          operator()(fn,this,parent);
  if (vVar2 == VISIT_BREAK) {
    this_local._4_4_ = VISIT_BREAK;
  }
  else {
    if (vVar2 != VISIT_CONTINUE) {
      __end4 = std::
               vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
               ::begin(&this->children);
      c = (shared_ptr<dtc::fdt::node> *)
          std::
          vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
          ::end(&this->children);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<std::shared_ptr<dtc::fdt::node>_*,_std::vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>_>
                                         *)&c), bVar1) {
        local_50 = (__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   __gnu_cxx::
                   __normal_iterator<std::shared_ptr<dtc::fdt::node>_*,_std::vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>_>
                   ::operator*(&__end4);
        this_00 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(local_50);
        std::function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)>::function
                  (&local_70,fn);
        vVar2 = visit(this_00,&local_70,this);
        std::function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)>::
        ~function(&local_70);
        if (vVar2 != VISIT_RECURSE) {
          return vVar2;
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<dtc::fdt::node>_*,_std::vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>_>
        ::operator++(&__end4);
      }
    }
    this_local._4_4_ = VISIT_RECURSE;
  }
  return this_local._4_4_;
}

Assistant:

node::visit_behavior
node::visit(std::function<visit_behavior(node&, node*)> fn, node *parent)
{
	visit_behavior behavior;
	behavior = fn(*this, parent);
	if (behavior == VISIT_BREAK)
	{
		return VISIT_BREAK;
	}
	else if (behavior != VISIT_CONTINUE)
	{
		for (auto &&c : children)
		{
			behavior = c->visit(fn, this);
			// Any status other than VISIT_RECURSE stops our execution and
			// bubbles up to our caller.  The caller may then either continue
			// visiting nodes that are siblings to this one or completely halt
			// visiting.
			if (behavior != VISIT_RECURSE)
			{
				return behavior;
			}
		}
	}
	// Continue recursion by default
	return VISIT_RECURSE;
}